

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

bool __thiscall jrtplib::RTCPSDESPacket::GotoFirstItem(RTCPSDESPacket *this)

{
  RTCPSDESHeader *sdeshdr;
  RTCPSDESPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else if (this->currentchunk == (uint8_t *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this->itemoffset = 4;
    if (this->currentchunk[this->itemoffset] == '\0') {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool RTCPSDESPacket::GotoFirstItem()
{
	if (!knownformat)
		return false;
	if (currentchunk == 0)
		return false;
	itemoffset = sizeof(uint32_t);
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid == 0)
		return false;
	return true;
}